

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitStream.cc
# Opt level: O3

void __thiscall BitStream::skipToNextByte(BitStream *this)

{
  ulong uVar1;
  logic_error *this_00;
  
  if (this->bit_offset != 7) {
    uVar1 = this->bit_offset + 1;
    if (this->bits_available < uVar1) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (this_00,"INTERNAL ERROR: overflow skipping to next byte in bitstream");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    this->bit_offset = 7;
    this->p = this->p + 1;
    this->bits_available = this->bits_available - uVar1;
  }
  return;
}

Assistant:

void
BitStream::skipToNextByte()
{
    if (bit_offset != 7) {
        size_t bits_to_skip = bit_offset + 1;
        if (bits_available < bits_to_skip) {
            throw std::logic_error("INTERNAL ERROR: overflow skipping to next byte in bitstream");
        }
        bit_offset = 7;
        ++p;
        bits_available -= bits_to_skip;
    }
}